

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,Kind closing,path *path)

{
  BlockNode **__args;
  size_t __n;
  char *pcVar1;
  _Elt_pointer ppIVar2;
  IfStatementNode *pIVar3;
  size_t sVar4;
  BlockNode *pBVar5;
  size_t sVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  Kind closing_00;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  long *plVar14;
  ParserError *pPVar15;
  _Elt_pointer ppIVar16;
  long *plVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer ppIVar18;
  size_type __rlen;
  _Elt_pointer ppFVar19;
  _Elt_pointer ppBVar20;
  Token *pTVar21;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_bool>
  pVar22;
  SourceLocation SVar23;
  string key;
  shared_ptr<inja::ForStatementNode> for_statement_node;
  shared_ptr<inja::SetStatementNode> set_statement_node;
  string local_e0;
  Token *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  Kind local_70;
  undefined1 local_69;
  undefined1 local_68 [40];
  shared_ptr<inja::SetStatementNode> local_40;
  
  if (((this->tok).kind == Id) && (__n = (this->tok).text._M_len, __n - 2 < 7)) {
    local_c0 = &this->tok;
    pcVar1 = (this->tok).text._M_str;
    local_70 = closing;
    switch(__n) {
    case 2:
      iVar13 = bcmp(pcVar1,"if",__n);
      if (iVar13 != 0) {
        switch(__n) {
        case 3:
          goto switchD_001613c5_caseD_3;
        case 4:
          goto switchD_001613c5_caseD_4;
        case 5:
          goto switchD_001613c5_caseD_5;
        case 6:
          goto switchD_001613c5_caseD_6;
        case 7:
          goto switchD_001613c5_caseD_7;
        case 8:
          goto switchD_001613c5_caseD_8;
        default:
          goto switchD_001613fd_default;
        }
      }
      if (this->have_peek_tok == true) {
        (local_c0->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        local_c0->kind = (this->peek_tok).kind;
        *(undefined4 *)&local_c0->field_0x4 = uVar8;
        (local_c0->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
        (local_c0->text)._M_len = local_e0._M_string_length;
      }
      local_b8._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::IfStatementNode,std::allocator<inja::IfStatementNode>,inja::BlockNode*&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e0._M_string_length,
                 (IfStatementNode **)&local_e0,(allocator<inja::IfStatementNode> *)&local_98,
                 &this->current_block,(long *)&local_b8);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::IfStatementNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,(shared_ptr<inja::IfStatementNode> *)&local_e0);
      local_b8._M_dataplus._M_p = local_e0._M_dataplus._M_p;
      ::std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>::
      emplace_back<inja::IfStatementNode*>
                ((deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>> *)
                 &this->if_statement_stack,(IfStatementNode **)&local_b8);
      this->current_block = (BlockNode *)(local_e0._M_dataplus._M_p + 0x30);
      this->current_expression_list = (ExpressionListNode *)(local_e0._M_dataplus._M_p + 0x10);
      bVar12 = parse_expression(this,tmpl,local_70);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length;
      goto LAB_00162034;
    case 3:
switchD_001613c5_caseD_3:
      iVar13 = bcmp(pcVar1,"for",__n);
      if (iVar13 != 0) {
        if (__n != 3) {
          if (__n != 7) {
            if (__n != 6) goto switchD_001613fd_default;
            goto switchD_001613c5_caseD_6;
          }
          break;
        }
        goto LAB_00161581;
      }
      if (this->have_peek_tok == true) {
        (local_c0->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        local_c0->kind = (this->peek_tok).kind;
        *(undefined4 *)&local_c0->field_0x4 = uVar8;
        (local_c0->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
        (local_c0->text)._M_len = local_e0._M_string_length;
      }
      pTVar21 = local_c0;
      if (local_c0->kind != Id) {
        Token::describe_abi_cxx11_(&local_98,local_c0);
        ::std::operator+(&local_b8,"expected id, got \'",&local_98);
        plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
        plVar17 = plVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar17) {
          local_e0.field_2._M_allocated_capacity = *plVar17;
          local_e0.field_2._8_8_ = plVar14[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *plVar17;
          local_e0._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_e0._M_string_length = plVar14[1];
        *plVar14 = (long)plVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        throw_parser_error(this,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      sVar4 = (this->tok).text._M_len;
      pcVar1 = (this->tok).text._M_str;
      if (this->have_peek_tok == true) {
        (pTVar21->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar6 = (this->peek_tok).text._M_len;
        pTVar21->kind = (this->peek_tok).kind;
        *(undefined4 *)&pTVar21->field_0x4 = uVar8;
        (pTVar21->text)._M_len = sVar6;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (pTVar21->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)pTVar21 = local_e0._M_dataplus._M_p;
        (pTVar21->text)._M_len = local_e0._M_string_length;
      }
      local_68._0_8_ = (element_type *)0x0;
      local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (pTVar21->kind == Comma) {
        if (this->have_peek_tok == true) {
          (pTVar21->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar6 = (this->peek_tok).text._M_len;
          pTVar21->kind = (this->peek_tok).kind;
          *(undefined4 *)&pTVar21->field_0x4 = uVar8;
          (pTVar21->text)._M_len = sVar6;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_e0,&this->lexer);
          (pTVar21->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
          *(pointer *)pTVar21 = local_e0._M_dataplus._M_p;
          (pTVar21->text)._M_len = local_e0._M_string_length;
        }
        if (pTVar21->kind != Id) {
          Token::describe_abi_cxx11_(&local_98,pTVar21);
          ::std::operator+(&local_b8,"expected id, got \'",&local_98);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
          plVar17 = plVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_e0.field_2._M_allocated_capacity = *plVar17;
            local_e0.field_2._8_8_ = plVar14[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *plVar17;
            local_e0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_e0._M_string_length = plVar14[1];
          *plVar14 = (long)plVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          throw_parser_error(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            (ulong)(local_b8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        sVar6 = (this->tok).text._M_len;
        pcVar7 = (this->tok).text._M_str;
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar10 = (this->peek_tok).text._M_len;
          uVar9 = *(undefined4 *)((long)&(this->peek_tok).text._M_len + 4);
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          *(int *)&(local_c0->text)._M_len = (int)sVar10;
          *(undefined4 *)((long)&(local_c0->text)._M_len + 4) = uVar9;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_e0,&this->lexer);
          (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
          local_c0->kind = (Kind)local_e0._M_dataplus._M_p;
          *(undefined4 *)&local_c0->field_0x4 = local_e0._M_dataplus._M_p._4_4_;
          *(undefined4 *)&(local_c0->text)._M_len = (undefined4)local_e0._M_string_length;
          *(undefined4 *)((long)&(local_c0->text)._M_len + 4) = local_e0._M_string_length._4_4_;
        }
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar1,pcVar1 + sVar4)
        ;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar7,pcVar7 + sVar6)
        ;
        local_40.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p);
        local_98._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::ForObjectStatementNode,std::allocator<inja::ForObjectStatementNode>,std::__cxx11::string,std::__cxx11::string,inja::BlockNode*&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length,
                   (ForObjectStatementNode **)&local_98,
                   (allocator<inja::ForObjectStatementNode> *)&local_69,&local_e0,&local_b8,
                   &this->current_block,(long *)&local_40);
        uVar11 = local_68._8_8_;
        local_68._8_8_ = local_98._M_string_length;
        local_68._0_8_ = local_98._M_dataplus._M_p;
        pTVar21 = local_c0;
        local_98._M_dataplus._M_p = (char *)0x0;
        local_98._M_string_length = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
LAB_00161e83:
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
      }
      else {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar1,pcVar1 + sVar4)
        ;
        local_98._M_dataplus._M_p =
             (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::ForArrayStatementNode,std::allocator<inja::ForArrayStatementNode>,std::__cxx11::string,inja::BlockNode*&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                   (ForArrayStatementNode **)&local_b8,
                   (allocator<inja::ForArrayStatementNode> *)&local_40,&local_e0,
                   &this->current_block,(long *)&local_98);
        uVar11 = local_68._8_8_;
        local_68._8_8_ = local_b8._M_string_length;
        local_68._0_8_ = local_b8._M_dataplus._M_p;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_00161e83;
      }
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::ForStatementNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,(shared_ptr<inja::ForStatementNode> *)local_68);
      local_e0._M_dataplus._M_p = (pointer)local_68._0_8_;
      ::std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>::
      emplace_back<inja::ForStatementNode*>
                ((deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>> *)
                 &this->for_statement_stack,(ForStatementNode **)&local_e0);
      this->current_block = (BlockNode *)(local_68._0_8_ + 0x30);
      this->current_expression_list = (ExpressionListNode *)(local_68._0_8_ + 0x10);
      if ((((this->tok).kind != Id) || ((this->tok).text._M_len != 2)) ||
         (iVar13 = bcmp((this->tok).text._M_str,"in",2), iVar13 != 0)) {
        Token::describe_abi_cxx11_(&local_98,pTVar21);
        ::std::operator+(&local_b8,"expected \'in\', got \'",&local_98);
        plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
        plVar17 = plVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar17) {
          local_e0.field_2._M_allocated_capacity = *plVar17;
          local_e0.field_2._8_8_ = plVar14[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *plVar17;
          local_e0._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_e0._M_string_length = plVar14[1];
        *plVar14 = (long)plVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        throw_parser_error(this,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->have_peek_tok == true) {
        (pTVar21->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        pTVar21->kind = (this->peek_tok).kind;
        *(undefined4 *)&pTVar21->field_0x4 = uVar8;
        (pTVar21->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (pTVar21->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)pTVar21 = local_e0._M_dataplus._M_p;
        (pTVar21->text)._M_len = local_e0._M_string_length;
      }
      bVar12 = parse_expression(this,tmpl,local_70);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
LAB_00162034:
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      goto LAB_00162392;
    case 4:
switchD_001613c5_caseD_4:
      iVar13 = bcmp(pcVar1,"else",__n);
      if (iVar13 != 0) {
        switch(__n) {
        case 3:
          goto switchD_001613c5_caseD_3;
        default:
          goto switchD_00161471_caseD_1;
        case 5:
          goto switchD_001613c5_caseD_5;
        case 6:
          goto switchD_001613c5_caseD_6;
        case 7:
          goto switchD_001613c5_caseD_7;
        case 8:
          goto switchD_001613c5_caseD_8;
        }
      }
      ppIVar18 = (this->if_statement_stack).c.
                 super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppIVar18 ==
          (this->if_statement_stack).c.
          super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"else without matching if","");
        pPVar15 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar23 = Lexer::current_position(&this->lexer);
        ParserError::ParserError(pPVar15,&local_e0,SVar23);
        __cxa_throw(pPVar15,&ParserError::typeinfo,InjaError::~InjaError);
      }
      if (ppIVar18 ==
          (this->if_statement_stack).c.
          super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppIVar18 = (this->if_statement_stack).c.
                   super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if (this->have_peek_tok == true) {
        (local_c0->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        local_c0->kind = (this->peek_tok).kind;
        *(undefined4 *)&local_c0->field_0x4 = uVar8;
        (local_c0->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
        (local_c0->text)._M_len = local_e0._M_string_length;
      }
      pIVar3 = ppIVar18[-1];
      pIVar3->has_false_statement = true;
      this->current_block = &pIVar3->false_statement;
      if ((this->tok).kind != Id) {
        return true;
      }
      if ((this->tok).text._M_len != 2) {
        return true;
      }
      iVar13 = bcmp((this->tok).text._M_str,"if",2);
      if (iVar13 != 0) {
        return true;
      }
      if (this->have_peek_tok == true) {
        (local_c0->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        local_c0->kind = (this->peek_tok).kind;
        *(undefined4 *)&local_c0->field_0x4 = uVar8;
        (local_c0->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
        (local_c0->text)._M_len = local_e0._M_string_length;
      }
      local_68[0] = 1;
      local_b8._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::IfStatementNode,std::allocator<inja::IfStatementNode>,bool,inja::BlockNode*&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e0._M_string_length,
                 (IfStatementNode **)&local_e0,(allocator<inja::IfStatementNode> *)&local_98,
                 (bool *)local_68,&this->current_block,(long *)&local_b8);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::IfStatementNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,(shared_ptr<inja::IfStatementNode> *)&local_e0);
      local_b8._M_dataplus._M_p = local_e0._M_dataplus._M_p;
      ::std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>::
      emplace_back<inja::IfStatementNode*>
                ((deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>> *)
                 &this->if_statement_stack,(IfStatementNode **)&local_b8);
      this->current_block = (BlockNode *)(local_e0._M_dataplus._M_p + 0x30);
      this->current_expression_list = (ExpressionListNode *)(local_e0._M_dataplus._M_p + 0x10);
      bVar12 = parse_expression(this,tmpl,local_70);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length;
      goto LAB_00162034;
    case 5:
switchD_001613c5_caseD_5:
      iVar13 = bcmp(pcVar1,"endif",__n);
      if (iVar13 == 0) {
        if ((this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          while( true ) {
            ppIVar18 = (this->if_statement_stack).c.
                       super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            ppIVar2 = (this->if_statement_stack).c.
                      super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first;
            ppIVar16 = ppIVar18;
            if (ppIVar18 == ppIVar2) {
              ppIVar16 = (this->if_statement_stack).c.
                         super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            if (ppIVar16[-1]->is_nested != true) break;
            std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::pop_back
                      (&(this->if_statement_stack).c);
          }
          if (ppIVar18 == ppIVar2) {
            ppIVar18 = (this->if_statement_stack).c.
                       super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          if (this->have_peek_tok == true) {
            (local_c0->text)._M_str = (this->peek_tok).text._M_str;
            uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
            sVar4 = (this->peek_tok).text._M_len;
            local_c0->kind = (this->peek_tok).kind;
            *(undefined4 *)&local_c0->field_0x4 = uVar8;
            (local_c0->text)._M_len = sVar4;
            this->have_peek_tok = false;
          }
          else {
            Lexer::scan((Token *)&local_e0,&this->lexer);
            (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
            *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
            (local_c0->text)._M_len = local_e0._M_string_length;
          }
          this->current_block = ppIVar18[-1]->parent;
          std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::pop_back
                    (&(this->if_statement_stack).c);
          return true;
        }
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"endif without matching if","");
        pPVar15 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar23 = Lexer::current_position(&this->lexer);
        ParserError::ParserError(pPVar15,&local_e0,SVar23);
        __cxa_throw(pPVar15,&ParserError::typeinfo,InjaError::~InjaError);
      }
      switch(__n - 3) {
      case 0:
        goto switchD_001613c5_caseD_3;
      default:
        goto switchD_00161471_caseD_1;
      case 2:
        iVar13 = bcmp(pcVar1,"block",__n);
        if (iVar13 != 0) {
          switch(__n - 3) {
          case 0:
            goto switchD_001613c5_caseD_3;
          default:
            goto switchD_00161471_caseD_1;
          case 3:
            goto switchD_001613c5_caseD_6;
          case 4:
            goto switchD_001613c5_caseD_7;
          case 5:
            goto switchD_001613c5_caseD_8;
          }
        }
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          (local_c0->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_e0,&this->lexer);
          (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
          *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
          (local_c0->text)._M_len = local_e0._M_string_length;
        }
        if (local_c0->kind != Id) {
          Token::describe_abi_cxx11_(&local_98,local_c0);
          ::std::operator+(&local_b8,"expected block name, got \'",&local_98);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
          plVar17 = plVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_e0.field_2._M_allocated_capacity = *plVar17;
            local_e0.field_2._8_8_ = plVar14[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *plVar17;
            local_e0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_e0._M_string_length = plVar14[1];
          *plVar14 = (long)plVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          throw_parser_error(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            (ulong)(local_b8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar1 = (this->tok).text._M_str;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,pcVar1,pcVar1 + (this->tok).text._M_len);
        __args = &this->current_block;
        local_b8._M_dataplus._M_p =
             (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
        local_68._0_8_ = (element_type *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::BlockStatementNode,std::allocator<inja::BlockStatementNode>,inja::BlockNode*&,std::__cxx11::string_const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
                   (BlockStatementNode **)local_68,(allocator<inja::BlockStatementNode> *)&local_98,
                   __args,&local_e0,(long *)&local_b8);
        ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
        ::emplace_back<std::shared_ptr<inja::BlockStatementNode>&>
                  ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                    *)&(*__args)->nodes,(shared_ptr<inja::BlockStatementNode> *)local_68);
        local_b8._M_dataplus._M_p = (pointer)local_68._0_8_;
        ::std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>::
        emplace_back<inja::BlockStatementNode*>
                  ((deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>> *)
                   &this->block_statement_stack,(BlockStatementNode **)&local_b8);
        *__args = (BlockNode *)(local_68._0_8_ + 0x30);
        pVar22 = ::std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                 ::
                 _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<inja::BlockStatementNode>&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                             *)&tmpl->block_storage,&local_e0,
                            (shared_ptr<inja::BlockStatementNode> *)local_68);
        pTVar21 = local_c0;
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          ::std::operator+(&local_98,"block with the name \'",&local_e0);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_98);
          plVar17 = plVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_b8.field_2._M_allocated_capacity = *plVar17;
            local_b8.field_2._8_8_ = plVar14[3];
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *plVar17;
            local_b8._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_b8._M_string_length = plVar14[1];
          *plVar14 = (long)plVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          throw_parser_error(this,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            (ulong)(local_b8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        if (this->have_peek_tok == true) {
          (pTVar21->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          pTVar21->kind = (this->peek_tok).kind;
          *(undefined4 *)&pTVar21->field_0x4 = uVar8;
          (pTVar21->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_b8,&this->lexer);
          (pTVar21->text)._M_str = (char *)local_b8.field_2._M_allocated_capacity;
          *(pointer *)pTVar21 = local_b8._M_dataplus._M_p;
          (pTVar21->text)._M_len = local_b8._M_string_length;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
          return true;
        }
        break;
      case 3:
        goto switchD_001613c5_caseD_6;
      case 4:
        goto switchD_001613c5_caseD_7;
      case 5:
        goto switchD_001613c5_caseD_8;
      }
      goto LAB_00161940;
    case 6:
switchD_001613c5_caseD_6:
      iVar13 = bcmp(pcVar1,"endfor",__n);
      if (iVar13 == 0) {
        if ((this->for_statement_stack).c.
            super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->for_statement_stack).c.
            super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"endfor without matching for","");
          throw_parser_error(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
        }
        ppFVar19 = (this->for_statement_stack).c.
                   super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppFVar19 ==
            (this->for_statement_stack).c.
            super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppFVar19 = (this->for_statement_stack).c.
                     super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          (local_c0->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_e0,&this->lexer);
          (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
          *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
          (local_c0->text)._M_len = local_e0._M_string_length;
        }
        this->current_block = ppFVar19[-1]->parent;
        std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>::pop_back
                  (&(this->for_statement_stack).c);
        return true;
      }
      if (__n != 3) {
        if (__n != 7) goto switchD_001613fd_default;
        break;
      }
      goto LAB_00161581;
    case 8:
switchD_001613c5_caseD_8:
      iVar13 = bcmp(pcVar1,"endblock",__n);
      if (iVar13 == 0) {
        if ((this->block_statement_stack).c.
            super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->block_statement_stack).c.
            super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"endblock without matching block","");
          throw_parser_error(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
        }
        ppBVar20 = (this->block_statement_stack).c.
                   super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppBVar20 ==
            (this->block_statement_stack).c.
            super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppBVar20 = (this->block_statement_stack).c.
                     super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          (local_c0->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_e0,&this->lexer);
          (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
          *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
          (local_c0->text)._M_len = local_e0._M_string_length;
        }
        this->current_block = ppBVar20[-1]->parent;
        std::deque<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>::
        pop_back(&(this->block_statement_stack).c);
        return true;
      }
      if (__n != 7) {
        if (__n != 6) {
          if (__n != 3) goto switchD_001613fd_default;
          goto switchD_001613c5_caseD_3;
        }
        goto switchD_001613c5_caseD_6;
      }
    }
switchD_001613c5_caseD_7:
    iVar13 = bcmp(pcVar1,"include",__n);
    if (iVar13 == 0) {
      if (this->have_peek_tok == true) {
        (local_c0->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        local_c0->kind = (this->peek_tok).kind;
        *(undefined4 *)&local_c0->field_0x4 = uVar8;
        (local_c0->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
        (local_c0->text)._M_len = local_e0._M_string_length;
      }
      pTVar21 = local_c0;
      parse_filename_abi_cxx11_(&local_e0,this);
      add_to_template_storage(this,path,&local_e0);
      pBVar5 = this->current_block;
      local_98._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::IncludeStatementNode,std::allocator<inja::IncludeStatementNode>,std::__cxx11::string&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (IncludeStatementNode **)&local_b8,
                 (allocator<inja::IncludeStatementNode> *)local_68,&local_e0,(long *)&local_98);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::IncludeStatementNode>>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&pBVar5->nodes,(shared_ptr<inja::IncludeStatementNode> *)&local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if (this->have_peek_tok == true) {
LAB_001618f3:
        (pTVar21->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        pTVar21->kind = (this->peek_tok).kind;
        *(undefined4 *)&pTVar21->field_0x4 = uVar8;
        (pTVar21->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_b8,&this->lexer);
LAB_0016191b:
        (pTVar21->text)._M_str = (char *)local_b8.field_2._M_allocated_capacity;
        *(pointer *)pTVar21 = local_b8._M_dataplus._M_p;
        (pTVar21->text)._M_len = local_b8._M_string_length;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
LAB_00161940:
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      return true;
    }
    if (__n == 3) {
LAB_00161581:
      iVar13 = bcmp(pcVar1,"set",__n);
      if (iVar13 == 0) {
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          (local_c0->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_e0,&this->lexer);
          (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
          *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
          (local_c0->text)._M_len = local_e0._M_string_length;
        }
        closing_00 = local_70;
        if (local_c0->kind != Id) {
          Token::describe_abi_cxx11_(&local_98,local_c0);
          ::std::operator+(&local_b8,"expected variable name, got \'",&local_98);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
          plVar17 = plVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_e0.field_2._M_allocated_capacity = *plVar17;
            local_e0.field_2._8_8_ = plVar14[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *plVar17;
            local_e0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_e0._M_string_length = plVar14[1];
          *plVar14 = (long)plVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          throw_parser_error(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            (ulong)(local_b8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar1 = (this->tok).text._M_str;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,pcVar1,pcVar1 + (this->tok).text._M_len);
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          (local_c0->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_b8,&this->lexer);
          (local_c0->text)._M_str = (char *)local_b8.field_2._M_allocated_capacity;
          *(pointer *)local_c0 = local_b8._M_dataplus._M_p;
          (local_c0->text)._M_len = local_b8._M_string_length;
        }
        local_b8._M_dataplus._M_p =
             (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
        local_40.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::SetStatementNode,std::allocator<inja::SetStatementNode>,std::__cxx11::string_const&,long>
                  (&local_40.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(SetStatementNode **)&local_40,
                   (allocator<inja::SetStatementNode> *)&local_98,&local_e0,(long *)&local_b8);
        ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
        ::emplace_back<std::shared_ptr<inja::SetStatementNode>&>
                  ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                    *)&this->current_block->nodes,&local_40);
        this->current_expression_list =
             &(local_40.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->expression;
        if (((this->tok).text._M_len != 1) ||
           (iVar13 = bcmp((this->tok).text._M_str,"=",1), iVar13 != 0)) {
          Token::describe_abi_cxx11_((string *)local_68,local_c0);
          ::std::operator+(&local_98,"expected \'=\', got \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_98);
          plVar17 = plVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_b8.field_2._M_allocated_capacity = *plVar17;
            local_b8.field_2._8_8_ = plVar14[3];
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *plVar17;
            local_b8._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_b8._M_string_length = plVar14[1];
          *plVar14 = (long)plVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          throw_parser_error(this,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            (ulong)(local_b8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((element_type *)local_68._0_8_ != (element_type *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
        }
        if (this->have_peek_tok == true) {
          (local_c0->text)._M_str = (this->peek_tok).text._M_str;
          uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
          sVar4 = (this->peek_tok).text._M_len;
          local_c0->kind = (this->peek_tok).kind;
          *(undefined4 *)&local_c0->field_0x4 = uVar8;
          (local_c0->text)._M_len = sVar4;
          this->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)&local_b8,&this->lexer);
          (local_c0->text)._M_str = (char *)local_b8.field_2._M_allocated_capacity;
          *(pointer *)local_c0 = local_b8._M_dataplus._M_p;
          (local_c0->text)._M_len = local_b8._M_string_length;
        }
        bVar12 = parse_expression(this,tmpl,closing_00);
        if (local_40.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
LAB_00162392:
        if (bVar12 != false) {
          return true;
        }
      }
    }
    else if ((__n == 7) && (iVar13 = bcmp(pcVar1,"extends",7), iVar13 == 0)) {
      if (this->have_peek_tok == true) {
        (local_c0->text)._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        local_c0->kind = (this->peek_tok).kind;
        *(undefined4 *)&local_c0->field_0x4 = uVar8;
        (local_c0->text)._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_e0,&this->lexer);
        (local_c0->text)._M_str = (char *)local_e0.field_2._M_allocated_capacity;
        *(pointer *)local_c0 = local_e0._M_dataplus._M_p;
        (local_c0->text)._M_len = local_e0._M_string_length;
      }
      pTVar21 = local_c0;
      parse_filename_abi_cxx11_(&local_e0,this);
      add_to_template_storage(this,path,&local_e0);
      pBVar5 = this->current_block;
      local_98._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::ExtendsStatementNode,std::allocator<inja::ExtendsStatementNode>,std::__cxx11::string&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (ExtendsStatementNode **)&local_b8,
                 (allocator<inja::ExtendsStatementNode> *)local_68,&local_e0,(long *)&local_98);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::ExtendsStatementNode>>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&pBVar5->nodes,(shared_ptr<inja::ExtendsStatementNode> *)&local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if (this->have_peek_tok == true) goto LAB_001618f3;
      Lexer::scan((Token *)&local_b8,&this->lexer);
      goto LAB_0016191b;
    }
  }
switchD_001613fd_default:
switchD_00161471_caseD_1:
  return false;
}

Assistant:

bool parse_statement(Template& tmpl, Token::Kind closing, const std::filesystem::path& path) {
    if (tok.kind != Token::Kind::Id) {
      return false;
    }

    if (tok.text == static_cast<decltype(tok.text)>("if")) {
      get_next_token();

      auto if_statement_node = std::make_shared<IfStatementNode>(current_block, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(if_statement_node);
      if_statement_stack.emplace(if_statement_node.get());
      current_block = &if_statement_node->true_statement;
      current_expression_list = &if_statement_node->condition;

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("else")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("else without matching if");
      }
      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      if_statement_data->has_false_statement = true;
      current_block = &if_statement_data->false_statement;

      // Chained else if
      if (tok.kind == Token::Kind::Id && tok.text == static_cast<decltype(tok.text)>("if")) {
        get_next_token();

        auto if_statement_node = std::make_shared<IfStatementNode>(true, current_block, tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(if_statement_node);
        if_statement_stack.emplace(if_statement_node.get());
        current_block = &if_statement_node->true_statement;
        current_expression_list = &if_statement_node->condition;

        if (!parse_expression(tmpl, closing)) {
          return false;
        }
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endif")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("endif without matching if");
      }

      // Nested if statements
      while (if_statement_stack.top()->is_nested) {
        if_statement_stack.pop();
      }

      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      current_block = if_statement_data->parent;
      if_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("block")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected block name, got '" + tok.describe() + "'");
      }

      const std::string block_name = static_cast<std::string>(tok.text);

      auto block_statement_node = std::make_shared<BlockStatementNode>(current_block, block_name, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(block_statement_node);
      block_statement_stack.emplace(block_statement_node.get());
      current_block = &block_statement_node->block;
      auto success = tmpl.block_storage.emplace(block_name, block_statement_node);
      if (!success.second) {
        throw_parser_error("block with the name '" + block_name + "' does already exist");
      }

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("endblock")) {
      if (block_statement_stack.empty()) {
        throw_parser_error("endblock without matching block");
      }

      auto& block_statement_data = block_statement_stack.top();
      get_next_token();

      current_block = block_statement_data->parent;
      block_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("for")) {
      get_next_token();

      // options: for a in arr; for a, b in obj
      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected id, got '" + tok.describe() + "'");
      }

      Token value_token = tok;
      get_next_token();

      // Object type
      std::shared_ptr<ForStatementNode> for_statement_node;
      if (tok.kind == Token::Kind::Comma) {
        get_next_token();
        if (tok.kind != Token::Kind::Id) {
          throw_parser_error("expected id, got '" + tok.describe() + "'");
        }

        const Token key_token = std::move(value_token);
        value_token = tok;
        get_next_token();

        for_statement_node = std::make_shared<ForObjectStatementNode>(static_cast<std::string>(key_token.text), static_cast<std::string>(value_token.text),
                                                                      current_block, tok.text.data() - tmpl.content.c_str());

        // Array type
      } else {
        for_statement_node =
            std::make_shared<ForArrayStatementNode>(static_cast<std::string>(value_token.text), current_block, tok.text.data() - tmpl.content.c_str());
      }

      current_block->nodes.emplace_back(for_statement_node);
      for_statement_stack.emplace(for_statement_node.get());
      current_block = &for_statement_node->body;
      current_expression_list = &for_statement_node->condition;

      if (tok.kind != Token::Kind::Id || tok.text != static_cast<decltype(tok.text)>("in")) {
        throw_parser_error("expected 'in', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endfor")) {
      if (for_statement_stack.empty()) {
        throw_parser_error("endfor without matching for");
      }

      auto& for_statement_data = for_statement_stack.top();
      get_next_token();

      current_block = for_statement_data->parent;
      for_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("include")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<IncludeStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("extends")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<ExtendsStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("set")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected variable name, got '" + tok.describe() + "'");
      }

      const std::string key = static_cast<std::string>(tok.text);
      get_next_token();

      auto set_statement_node = std::make_shared<SetStatementNode>(key, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(set_statement_node);
      current_expression_list = &set_statement_node->expression;

      if (tok.text != static_cast<decltype(tok.text)>("=")) {
        throw_parser_error("expected '=', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else {
      return false;
    }
    return true;
  }